

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog_p.h
# Opt level: O2

void __thiscall QAutoPointer<QFileDialog>::~QAutoPointer(QAutoPointer<QFileDialog> *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  
  pDVar1 = (this->o).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this->o).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)this);
  return;
}

Assistant:

~QAutoPointer() { delete o; }